

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDetectionResultColumn.cpp
# Opt level: O1

Nullable<ZXing::Pdf417::Codeword> * __thiscall
ZXing::Pdf417::DetectionResultColumn::codewordNearby
          (Nullable<ZXing::Pdf417::Codeword> *__return_storage_ptr__,DetectionResultColumn *this,
          int imageRow)

{
  bool *pbVar1;
  undefined8 uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  pointer pNVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  uVar4 = (this->_boundingBox)._minY;
  lVar8 = (long)(int)uVar4;
  lVar5 = (long)imageRow;
  uVar7 = lVar5 - lVar8;
  pNVar6 = (this->_codewords).
           super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = uVar7;
  if (pNVar6[uVar7].m_hasValue == false) {
    uVar4 = imageRow + ~uVar4;
    lVar9 = 0x18;
    while( true ) {
      uVar7 = uVar7 + 1;
      if ((-1 < (int)uVar4) && (uVar3 = (ulong)uVar4, pNVar6[uVar4].m_hasValue == true))
      goto LAB_00172e5e;
      if (((long)uVar7 <
           (long)((int)((ulong)((long)(this->_codewords).
                                      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar6) >>
                       3) * -0x55555555)) && ((&pNVar6[lVar5 - lVar8].m_hasValue)[lVar9] == true))
      break;
      lVar9 = lVar9 + 0x18;
      uVar4 = uVar4 - 1;
      if (lVar9 == 0x78) {
        __return_storage_ptr__->m_hasValue = false;
        (__return_storage_ptr__->m_value)._startX = 0;
        (__return_storage_ptr__->m_value)._endX = 0;
        (__return_storage_ptr__->m_value)._bucket = 0;
        (__return_storage_ptr__->m_value)._value = 0;
        (__return_storage_ptr__->m_value)._rowNumber = -1;
        return __return_storage_ptr__;
      }
    }
    uVar2 = *(undefined8 *)((long)&pNVar6[lVar5 - lVar8].m_value._value + lVar9);
    (__return_storage_ptr__->m_value)._value = (int)uVar2;
    (__return_storage_ptr__->m_value)._rowNumber = (int)((ulong)uVar2 >> 0x20);
    pbVar1 = &pNVar6[lVar5 - lVar8].m_hasValue + lVar9;
    uVar10 = *(undefined4 *)pbVar1;
    iVar11 = ((Codeword *)(pbVar1 + 4))->_startX;
    iVar12 = *(int *)(pbVar1 + 8);
    iVar13 = *(int *)(pbVar1 + 0xc);
  }
  else {
LAB_00172e5e:
    pNVar6 = pNVar6 + uVar3;
    iVar11 = (pNVar6->m_value)._rowNumber;
    (__return_storage_ptr__->m_value)._value = (pNVar6->m_value)._value;
    (__return_storage_ptr__->m_value)._rowNumber = iVar11;
    uVar10 = *(undefined4 *)pNVar6;
    iVar11 = (pNVar6->m_value)._startX;
    iVar12 = (pNVar6->m_value)._endX;
    iVar13 = (pNVar6->m_value)._bucket;
  }
  *(undefined4 *)__return_storage_ptr__ = uVar10;
  (__return_storage_ptr__->m_value)._startX = iVar11;
  (__return_storage_ptr__->m_value)._endX = iVar12;
  (__return_storage_ptr__->m_value)._bucket = iVar13;
  return __return_storage_ptr__;
}

Assistant:

Nullable<Codeword>
DetectionResultColumn::codewordNearby(int imageRow) const
{
	int index = imageRowToCodewordIndex(imageRow);
	if (_codewords[index] != nullptr) {
		return _codewords[index];
	}

	for (int i = 1; i < MAX_NEARBY_DISTANCE; i++) {
		int nearImageRow = imageRowToCodewordIndex(imageRow) - i;
		if (nearImageRow >= 0) {
			if (_codewords[nearImageRow] != nullptr) {
				return _codewords[nearImageRow];
			}
		}
		nearImageRow = imageRowToCodewordIndex(imageRow) + i;
		if (nearImageRow < Size(_codewords)) {
			if (_codewords[nearImageRow] != nullptr) {
				return _codewords[nearImageRow];
			}
		}
	}
	return nullptr;
}